

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::importRelative(ModuleImpl *this,StringPtr importPath)

{
  String *pSVar1;
  ReadableDirectory *dir;
  StringPtr pathText;
  char cVar2;
  size_t sVar3;
  char *in_RCX;
  char *pcVar4;
  PathPtr path;
  PathPtr path_00;
  ArrayPtr<const_kj::String> local_a8;
  Path local_98;
  PathPtr local_80 [2];
  ArrayPtr<const_char> local_60;
  Path local_50;
  PathPtr local_38;
  char *local_28;
  ModuleImpl *this_local;
  StringPtr importPath_local;
  
  this_local = (ModuleImpl *)importPath.content.size_;
  pcVar4 = importPath.content.ptr;
  local_28 = pcVar4;
  importPath_local.content.ptr = in_RCX;
  importPath_local.content.size_ = (size_t)this;
  sVar3 = kj::StringPtr::size((StringPtr *)&this_local);
  if ((sVar3 != 0) && (cVar2 = kj::StringPtr::operator[]((StringPtr *)&this_local,0), cVar2 == '/'))
  {
    pSVar1 = *(String **)(pcVar4 + 8);
    local_60 = (ArrayPtr<const_char>)kj::StringPtr::slice((StringPtr *)&this_local,1);
    kj::Path::parse(&local_50,(StringPtr)local_60);
    kj::PathPtr::PathPtr(&local_38,&local_50);
    path.parts.size_ = (size_t)local_38.parts.ptr;
    path.parts.ptr = pSVar1;
    ModuleLoader::Impl::loadModuleFromSearchPath((Impl *)this,path);
    kj::Path::~Path(&local_50);
    return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
  }
  dir = *(ReadableDirectory **)(pcVar4 + 8);
  pSVar1 = *(String **)(pcVar4 + 0x20);
  local_a8 = (ArrayPtr<const_kj::String>)kj::Path::parent((Path *)(pcVar4 + 0x28));
  pathText.content.size_ = (size_t)importPath_local.content.ptr;
  pathText.content.ptr = (char *)this_local;
  kj::PathPtr::eval(&local_98,(PathPtr *)&local_a8,pathText);
  kj::PathPtr::PathPtr(local_80,&local_98);
  path_00.parts.size_ = (size_t)local_80[0].parts.ptr;
  path_00.parts.ptr = pSVar1;
  ModuleLoader::Impl::loadModule((Impl *)this,dir,path_00);
  kj::Path::~Path(&local_98);
  return (Maybe<capnp::compiler::Module_&>)&this->super_Module;
}

Assistant:

kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    if (importPath.size() > 0 && importPath[0] == '/') {
      return loader.loadModuleFromSearchPath(kj::Path::parse(importPath.slice(1)));
    } else {
      return loader.loadModule(sourceDir, path.parent().eval(importPath));
    }
  }